

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::compute_update<false,true,false,true,true,1ul,2ul,3ul>(gd *g,example *ec)

{
  vw *pvVar1;
  example *in_RSI;
  gd *in_RDI;
  float extraout_XMM0_Da;
  float fVar2;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  double dVar3;
  double dVar4;
  double eta_bar;
  double dev1;
  float update_scale;
  float pred_per_update;
  float update;
  vw *all;
  label_data *ld;
  example *in_stack_ffffffffffffffb8;
  gd *in_stack_ffffffffffffffc0;
  float local_24;
  
  pvVar1 = in_RDI->all;
  local_24 = 0.0;
  in_RSI->updated_prediction = (in_RSI->pred).scalar;
  (*pvVar1->loss->_vptr_loss_function[1])(pvVar1->loss,pvVar1->sd);
  if (0.0 < extraout_XMM0_Da) {
    fVar2 = sensitivity<false,true,true,1ul,2ul,3ul,false>
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    get_scale<1ul>(in_RDI,in_RSI,in_RSI->weight);
    (*pvVar1->loss->_vptr_loss_function[2])();
    in_RSI->updated_prediction = fVar2 * extraout_XMM0_Da_00 + in_RSI->updated_prediction;
    local_24 = extraout_XMM0_Da_00;
    if ((pvVar1->reg_mode != 0) &&
       (dVar3 = std::fabs((double)(ulong)(uint)extraout_XMM0_Da_00), 1e-08 < SUB84(dVar3,0))) {
      (*pvVar1->loss->_vptr_loss_function[6])(pvVar1->loss,pvVar1->sd);
      dVar3 = (double)extraout_XMM0_Da_01;
      if (ABS(dVar3) <= 1e-08) {
        dVar4 = 0.0;
      }
      else {
        dVar4 = (double)-extraout_XMM0_Da_00 / dVar3;
      }
      if (1e-08 < ABS(dVar3)) {
        pvVar1->sd->contraction =
             (-(double)pvVar1->l2_lambda * dVar4 + 1.0) * pvVar1->sd->contraction;
      }
      local_24 = extraout_XMM0_Da_00 / (float)pvVar1->sd->contraction;
      pvVar1->sd->gravity = dVar4 * (double)pvVar1->l1_lambda + pvVar1->sd->gravity;
    }
  }
  return local_24;
}

Assistant:

float compute_update(gd& g, example& ec)
{
  // invariant: not a test label, importance weight > 0
  label_data& ld = ec.l.simple;
  vw& all = *g.all;

  float update = 0.;
  ec.updated_prediction = ec.pred.scalar;
  if (all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) > 0.)
  {
    float pred_per_update = sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, false>(g, ec);
    float update_scale = get_scale<adaptive>(g, ec, ec.weight);
    if (invariant)
      update = all.loss->getUpdate(ec.pred.scalar, ld.label, update_scale, pred_per_update);
    else
      update = all.loss->getUnsafeUpdate(ec.pred.scalar, ld.label, update_scale);
    // changed from ec.partial_prediction to ld.prediction
    ec.updated_prediction += pred_per_update * update;

    if (all.reg_mode && fabs(update) > 1e-8)
    {
      double dev1 = all.loss->first_derivative(all.sd, ec.pred.scalar, ld.label);
      double eta_bar = (fabs(dev1) > 1e-8) ? (-update / dev1) : 0.0;
      if (fabs(dev1) > 1e-8)
        all.sd->contraction *= (1. - all.l2_lambda * eta_bar);
      update /= (float)all.sd->contraction;
      all.sd->gravity += eta_bar * all.l1_lambda;
    }
  }

  if (sparse_l2)
    update -= g.sparse_l2 * ec.pred.scalar;

  return update;
}